

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  int iVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  const_iterator cVar2;
  TestFactoryBase *factory;
  char *pcVar3;
  allocator<char> local_452;
  allocator<char> local_451;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  CodeLocation local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  anon_class_72_2_4f66548f_for_factory_ local_3e8;
  string full_name;
  string message;
  anon_class_72_2_4f66548f_for_factory_ local_360;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  
  this = &GetIgnoredParameterizedTestSuites_abi_cxx11_()->_M_t;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(this,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->_M_impl).super__Rb_tree_header) {
    memcpy(kMissingInstantiation,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(kMissingTestCase,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_450,"Parameterized test suite ",name);
    pcVar3 = kMissingTestCase;
    if (has_test_p) {
      pcVar3 = kMissingInstantiation;
    }
    std::operator+(&local_408,&local_450,pcVar3);
    std::operator+(&local_430.file,&local_408,
                   "\n\nTo suppress this error for this test suite, insert the following line (in a non-header) in the namespace it is defined in:\n\nGTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST("
                  );
    std::operator+(&local_3e8.message,&local_430.file,name);
    std::operator+(&message,&local_3e8.message,");");
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_450);
    std::operator+(&local_3e8.message,"UninstantiatedParameterizedTestSuite<",name);
    std::operator+(&full_name,&local_3e8.message,">");
    std::__cxx11::string::~string((string *)&local_3e8);
    pcVar3 = (location->file)._M_dataplus._M_p;
    iVar1 = location->line;
    std::__cxx11::string::string((string *)&local_360,(string *)&message);
    CodeLocation::CodeLocation(&local_360.location,location);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"GoogleTestVerification",&local_451);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,pcVar3,&local_452);
    local_430.file._M_string_length = local_450._M_string_length;
    local_430.file._M_dataplus._M_p = (pointer)&local_430.file.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p == &local_450.field_2) {
      local_430.file.field_2._8_8_ = local_450.field_2._8_8_;
    }
    else {
      local_430.file._M_dataplus._M_p = local_450._M_dataplus._M_p;
    }
    local_450._M_string_length = 0;
    local_450.field_2._M_local_buf[0] = '\0';
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    local_430.line = iVar1;
    factory = (TestFactoryBase *)operator_new(0x50);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    __0((__0 *)&local_3e8,&local_360);
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    __0((__0 *)(factory + 1),&local_3e8);
    MakeAndRegisterTestInfo
              (&local_408,full_name._M_dataplus._M_p,(char *)0x0,(char *)0x0,&local_430,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    ~__0((__0 *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_408);
    InsertSyntheticTestCase(std::__cxx11::string_const&,testing::internal::CodeLocation,bool)::$_0::
    ~__0((__0 *)&local_360);
    std::__cxx11::string::~string((string *)&full_name);
    std::__cxx11::string::~string((string *)&message);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test "
      "cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}